

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O1

bool __thiscall dely_t::before(dely_t *this,coro_http_request *req,coro_http_response *res)

{
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  any user_data;
  _Arg __arg;
  any local_48;
  _Arg local_38;
  string local_30;
  
  local_38._M_obj = &local_48;
  local_48._M_storage._M_ptr = (void *)0x0;
  p_Var1 = (req->user_data_)._M_manager;
  if (p_Var1 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    local_48._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  else {
    (*p_Var1)(_Op_clone,&req->user_data_,&local_38);
  }
  local_38._M_obj = &local_48;
  before::anon_class_8_1_29cdea3e::operator()((anon_class_8_1_29cdea3e *)&local_38);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"unauthorized","");
  cinatra::coro_http_response::set_status_and_content
            (res,unauthorized,&local_30,none,(string_view)(ZEXT816(0x2dd48d) << 0x40));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_48._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_48._M_manager)(_Op_destroy,&local_48,(_Arg *)0x0);
  }
  return false;
}

Assistant:

bool before(coro_http_request &req, coro_http_response &res) {
    auto user_data = req.get_user_data();
    CHECK(!user_data.has_value());
    res.set_status_and_content(status_type::unauthorized, "unauthorized");
    return false;
  }